

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O1

void testProcrustesImp<double>(void)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  size_t numPoints;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> toPoints;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> fromPoints;
  Matrix44<double> tmp;
  Rand48 random;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_2a8;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_288;
  Matrix44<double> local_268;
  ushort local_1de [3];
  undefined1 local_1d8 [24];
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  double dStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  double dStack_160;
  Euler<double> local_158;
  Matrix44<double> local_138;
  Matrix44<double> local_b8;
  
  Imath_2_5::procrustesRotationAndTranslation<double>
            ((Vec3 *)&local_b8,(Vec3 *)0x0,(double *)0x0,0,false);
  local_178 = ZEXT816(0);
  local_198 = ZEXT816(0);
  local_1a8 = ZEXT816(0);
  stack0xfffffffffffffe38 = ZEXT816(0);
  local_1d8._0_16_ = ZEXT816(0x3ff0000000000000);
  local_1b8 = (undefined1  [8])0x0;
  dStack_1b0 = 1.0;
  local_188 = ZEXT816(0x3ff0000000000000);
  local_168 = (undefined1  [8])0x0;
  dStack_160 = 1.0;
  bVar3 = Imath_2_5::Matrix44<double>::operator==(&local_b8,(Matrix44<double> *)local_1d8);
  if (!bVar3) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,0x127,"void testProcrustesImp() [T = double]");
  }
  Imath_2_5::procrustesRotationAndTranslation<double>((Vec3 *)local_1d8,(Vec3 *)0x0,0,false);
  local_b8.x[0][0] = (double)local_1d8._0_8_;
  local_b8.x[0][1] = (double)local_1d8._8_8_;
  local_b8.x[0][2] = (double)local_1d8._16_8_;
  local_b8.x[0][3] = uStack_1c0;
  local_b8.x[1][0] = (double)local_1b8;
  local_b8.x[1][1] = dStack_1b0;
  local_b8.x[1][2] = (double)local_1a8._0_8_;
  local_b8.x[1][3] = (double)local_1a8._8_8_;
  local_b8.x[2][0] = (double)local_198._0_8_;
  local_b8.x[2][1] = (double)local_198._8_8_;
  local_b8.x[2][2] = (double)local_188._0_8_;
  local_b8.x[2][3] = (double)local_188._8_8_;
  local_b8.x[3][0] = (double)local_178._0_8_;
  local_b8.x[3][1] = (double)local_178._8_8_;
  local_b8.x[3][2] = (double)local_168;
  local_b8.x[3][3] = dStack_160;
  local_178 = ZEXT816(0);
  local_198 = ZEXT816(0);
  local_1a8 = ZEXT816(0);
  stack0xfffffffffffffe38 = ZEXT816(0);
  local_1d8._0_16_ = ZEXT816(0x3ff0000000000000);
  local_1b8 = (undefined1  [8])0x0;
  dStack_1b0 = 1.0;
  local_188 = ZEXT816(0x3ff0000000000000);
  local_168 = (undefined1  [8])0x0;
  dStack_160 = 1.0;
  bVar3 = Imath_2_5::Matrix44<double>::operator==(&local_b8,(Matrix44<double> *)local_1d8);
  if (!bVar3) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,300,"void testProcrustesImp() [T = double]");
  }
  local_178 = ZEXT816(0);
  local_198 = ZEXT816(0);
  local_1a8 = ZEXT816(0);
  stack0xfffffffffffffe38 = ZEXT816(0);
  local_1d8._0_16_ = ZEXT816(0x3ff0000000000000);
  local_1b8 = (undefined1  [8])0x0;
  dStack_1b0 = 1.0;
  local_188 = ZEXT816(0x3ff0000000000000);
  local_168 = (undefined1  [8])0x0;
  dStack_160 = 1.0;
  testTranslationRotationMatrix<double>((M44d *)local_1d8);
  dVar2 = (double)local_198._8_8_ * -0.2 + (double)local_1d8._8_8_ * 3.0 + dStack_1b0 * 5.0 +
          (double)local_178._8_8_;
  local_178._8_4_ = SUB84(dVar2,0);
  local_178._0_8_ =
       (double)local_198._0_8_ * -0.2 + (double)local_1d8._0_8_ * 3.0 + (double)local_1b8 * 5.0 +
       (double)local_178._0_8_;
  local_178._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_188._8_8_ * -0.2 + uStack_1c0 * 3.0 + (double)local_1a8._8_8_ * 5.0 +
          dStack_160;
  unique0x100015ae = SUB84(dVar2,0);
  local_168 = (undefined1  [8])
              ((double)local_188._0_8_ * -0.2 +
               (double)local_1d8._16_8_ * 3.0 + (double)local_1a8._0_8_ * 5.0 + (double)local_168);
  unique0x100015b2 = (int)((ulong)dVar2 >> 0x20);
  testTranslationRotationMatrix<double>((M44d *)local_1d8);
  local_268.x[0][0] = 3.141592653589793;
  local_268.x[0][1] = 0.0;
  local_268.x[0][2] = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)&local_268);
  testTranslationRotationMatrix<double>((M44d *)local_1d8);
  local_268.x[0][0] = 0.0;
  local_268.x[0][1] = 0.7853981633974483;
  local_268.x[0][2] = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)&local_268);
  testTranslationRotationMatrix<double>((M44d *)local_1d8);
  local_268.x[0][0] = 0.0;
  local_268.x[0][1] = 0.0;
  local_268.x[0][2] = -2.356194490192345;
  Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)&local_268);
  testTranslationRotationMatrix<double>((M44d *)local_1d8);
  local_178 = ZEXT816(0);
  local_198 = ZEXT816(0);
  local_1a8 = ZEXT816(0);
  stack0xfffffffffffffe38 = ZEXT816(0);
  local_1d8._0_16_ = ZEXT816(0x3ff0000000000000);
  local_1b8 = (undefined1  [8])0x0;
  dStack_1b0 = 1.0;
  local_188 = ZEXT816(0x3ff0000000000000);
  local_168 = (undefined1  [8])0x0;
  dStack_160 = 1.0;
  testWithTranslateRotateAndScale<double>((M44d *)local_1d8);
  local_178._8_8_ =
       (double)local_198._8_8_ * 10.0 + (double)local_1d8._8_8_ * 0.4 + dStack_1b0 * 6.0 +
       (double)local_178._8_8_;
  local_178._0_8_ =
       (double)local_198._0_8_ * 10.0 + (double)local_1d8._0_8_ * 0.4 + (double)local_1b8 * 6.0 +
       (double)local_178._0_8_;
  dVar2 = (double)local_188._8_8_ * 10.0 + uStack_1c0 * 0.4 + (double)local_1a8._8_8_ * 6.0 +
          dStack_160;
  unique0x100015d2 = SUB84(dVar2,0);
  local_168 = (undefined1  [8])
              ((double)local_188._0_8_ * 10.0 +
               (double)local_1d8._16_8_ * 0.4 + (double)local_1a8._0_8_ * 6.0 + (double)local_168);
  unique0x100015d6 = (int)((ulong)dVar2 >> 0x20);
  testWithTranslateRotateAndScale<double>((M44d *)local_1d8);
  local_268.x[0][0] = 3.141592653589793;
  local_268.x[0][1] = 0.0;
  local_268.x[0][2] = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)&local_268);
  testWithTranslateRotateAndScale<double>((M44d *)local_1d8);
  local_268.x[0][1] = 0.7853981633974483;
  local_268.x[0][0] = 0.0;
  local_268.x[0][2] = 0.0;
  Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)&local_268);
  testWithTranslateRotateAndScale<double>((M44d *)local_1d8);
  local_268.x[0][0] = 0.0;
  local_268.x[0][1] = 0.0;
  local_268.x[0][2] = -2.356194490192345;
  Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)&local_268);
  testWithTranslateRotateAndScale<double>((M44d *)local_1d8);
  dVar2 = (double)local_1d8._8_8_ + (double)local_1d8._8_8_;
  local_1d8._8_4_ = SUB84(dVar2,0);
  local_1d8._0_8_ = (double)local_1d8._0_8_ + (double)local_1d8._0_8_;
  local_1d8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = uStack_1c0 + uStack_1c0;
  uStack_1c0._0_4_ = SUB84(dVar2,0);
  local_1d8._16_8_ = (double)local_1d8._16_8_ + (double)local_1d8._16_8_;
  uStack_1c0._4_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = dStack_1b0 + dStack_1b0;
  unique0x10001cfe = SUB84(dVar2,0);
  local_1b8 = (undefined1  [8])((double)local_1b8 + (double)local_1b8);
  unique0x10001d02 = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_1a8._8_8_ + (double)local_1a8._8_8_;
  local_1a8._8_4_ = SUB84(dVar2,0);
  local_1a8._0_8_ = (double)local_1a8._0_8_ + (double)local_1a8._0_8_;
  local_1a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_198._8_8_ + (double)local_198._8_8_;
  local_198._8_4_ = SUB84(dVar2,0);
  local_198._0_8_ = (double)local_198._0_8_ + (double)local_198._0_8_;
  local_198._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_188._8_8_ + (double)local_188._8_8_;
  local_188._8_4_ = SUB84(dVar2,0);
  local_188._0_8_ = (double)local_188._0_8_ + (double)local_188._0_8_;
  local_188._12_4_ = (int)((ulong)dVar2 >> 0x20);
  testWithTranslateRotateAndScale<double>((M44d *)local_1d8);
  dVar2 = (double)local_1d8._8_8_ * 0.01;
  local_1d8._8_4_ = SUB84(dVar2,0);
  local_1d8._0_8_ = (double)local_1d8._0_8_ * 0.01;
  local_1d8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = uStack_1c0 * 0.01;
  uStack_1c0._0_4_ = SUB84(dVar2,0);
  local_1d8._16_8_ = (double)local_1d8._16_8_ * 0.01;
  uStack_1c0._4_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = dStack_1b0 * 0.01;
  unique0x10001662 = SUB84(dVar2,0);
  local_1b8 = (undefined1  [8])((double)local_1b8 * 0.01);
  unique0x10001666 = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_1a8._8_8_ * 0.01;
  local_1a8._8_4_ = SUB84(dVar2,0);
  local_1a8._0_8_ = (double)local_1a8._0_8_ * 0.01;
  local_1a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_198._8_8_ * 0.01;
  local_198._8_4_ = SUB84(dVar2,0);
  local_198._0_8_ = (double)local_198._0_8_ * 0.01;
  local_198._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_188._8_8_ * 0.01;
  local_188._8_4_ = SUB84(dVar2,0);
  local_188._0_8_ = (double)local_188._0_8_ * 0.01;
  local_188._12_4_ = (int)((ulong)dVar2 >> 0x20);
  testWithTranslateRotateAndScale<double>((M44d *)local_1d8);
  local_288.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 0;
  do {
    dVar2 = (double)lVar5 / 3.141592653589793;
    dVar1 = cos(dVar2);
    local_268.x[0][1] = sin(dVar2);
    local_268.x[0][2] = 0.0;
    local_268.x[0][0] = dVar1;
    std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
    emplace_back<Imath_2_5::Vec3<double>>
              ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&local_288
               ,(Vec3<double> *)&local_268);
    dVar1 = cos(dVar2 + 1.0471975511965976);
    local_268.x[0][1] = sin(dVar2 + 1.0471975511965976);
    local_268.x[0][2] = 0.0;
    local_268.x[0][0] = dVar1;
    std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
    emplace_back<Imath_2_5::Vec3<double>>
              ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&local_2a8
               ,(Vec3<double> *)&local_268);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  verifyProcrustes<double>(&local_288,&local_2a8);
  local_1de[0] = 0x7c67;
  local_1de[1] = 0x1005;
  local_1de[2] = 0x7c67;
  lVar5 = 1;
  do {
    if (local_288.
        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_288.
        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_288.
      super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_288.
           super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    lVar4 = lVar5;
    if (local_2a8.
        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_2a8.
        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_2a8.
      super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_2a8.
           super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    do {
      dVar2 = (double)Imath_2_5::erand48(local_1de);
      dVar1 = (double)Imath_2_5::erand48(local_1de);
      local_268.x[0][2] = (double)Imath_2_5::erand48(local_1de);
      local_268.x[0][0] = dVar2;
      local_268.x[0][1] = dVar1;
      std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
      emplace_back<Imath_2_5::Vec3<double>>
                ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)
                 &local_288,(Vec3<double> *)&local_268);
      dVar2 = (double)Imath_2_5::erand48(local_1de);
      dVar1 = (double)Imath_2_5::erand48(local_1de);
      local_268.x[0][2] = (double)Imath_2_5::erand48(local_1de);
      local_268.x[0][0] = dVar2;
      local_268.x[0][1] = dVar1;
      std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
      emplace_back<Imath_2_5::Vec3<double>>
                ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)
                 &local_2a8,(Vec3<double> *)&local_268);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  verifyProcrustes<double>(&local_288,&local_2a8);
  testProcrustesWithMatrix<double>((M44d *)local_1d8);
  dVar2 = (double)local_1d8._8_8_ * 3.0 + dStack_1b0 * 4.0 + (double)local_198._8_8_ +
          (double)local_178._8_8_;
  local_178._8_4_ = SUB84(dVar2,0);
  local_178._0_8_ =
       (double)local_1d8._0_8_ * 3.0 + (double)local_1b8 * 4.0 + (double)local_198._0_8_ +
       (double)local_178._0_8_;
  local_178._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = uStack_1c0 * 3.0 + (double)local_1a8._8_8_ * 4.0 + (double)local_188._8_8_ + dStack_160;
  unique0x100020de = SUB84(dVar2,0);
  local_168 = (undefined1  [8])
              ((double)local_1d8._16_8_ * 3.0 + (double)local_1a8._0_8_ * 4.0 +
               (double)local_188._0_8_ + (double)local_168);
  unique0x100020e2 = (int)((ulong)dVar2 >> 0x20);
  testProcrustesWithMatrix<double>((M44d *)local_1d8);
  dVar2 = (double)local_1d8._8_8_ * -10.0 + dStack_1b0 + dStack_1b0 + (double)local_198._8_8_ +
          (double)local_178._8_8_;
  local_178._8_4_ = SUB84(dVar2,0);
  local_178._0_8_ =
       (double)local_1d8._0_8_ * -10.0 + (double)local_1b8 + (double)local_1b8 +
       (double)local_198._0_8_ + (double)local_178._0_8_;
  local_178._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = uStack_1c0 * -10.0 + (double)local_1a8._8_8_ + (double)local_1a8._8_8_ +
          (double)local_188._8_8_ + dStack_160;
  unique0x100016ce = SUB84(dVar2,0);
  local_168 = (undefined1  [8])
              ((double)local_1d8._16_8_ * -10.0 + (double)local_1a8._0_8_ + (double)local_1a8._0_8_
               + (double)local_188._0_8_ + (double)local_168);
  unique0x100016d2 = (int)((ulong)dVar2 >> 0x20);
  testProcrustesWithMatrix<double>((M44d *)local_1d8);
  local_158._24_1_ = local_158._24_1_ & 0xe0 | 5;
  local_158.super_Vec3<double>.x = 1.0471975511965976;
  local_158.super_Vec3<double>.y = 2.356194490192345;
  local_158.super_Vec3<double>.z = 0.0;
  Imath_2_5::Euler<double>::toMatrix44(&local_138,&local_158);
  local_268.x[3][2] = 0.0;
  local_268.x[3][3] = 0.0;
  local_268.x[3][0] = 0.0;
  local_268.x[3][1] = 0.0;
  local_268.x[2][2] = 0.0;
  local_268.x[2][3] = 0.0;
  local_268.x[2][0] = 0.0;
  local_268.x[2][1] = 0.0;
  local_268.x[1][2] = 0.0;
  local_268.x[1][3] = 0.0;
  local_268.x[1][0] = 0.0;
  local_268.x[1][1] = 0.0;
  local_268.x[0][2] = 0.0;
  local_268.x[0][3] = 0.0;
  local_268.x[0][0] = 0.0;
  local_268.x[0][1] = 0.0;
  Imath_2_5::Matrix44<double>::multiply((Matrix44<double> *)local_1d8,&local_138,&local_268);
  local_1d8._0_8_ = local_268.x[0][0];
  local_1d8._8_8_ = local_268.x[0][1];
  local_1d8._16_8_ = local_268.x[0][2];
  uStack_1c0 = local_268.x[0][3];
  local_1b8 = (undefined1  [8])local_268.x[1][0];
  dStack_1b0 = local_268.x[1][1];
  local_1a8._0_8_ = local_268.x[1][2];
  local_1a8._8_8_ = local_268.x[1][3];
  local_198._0_8_ = local_268.x[2][0];
  local_198._8_8_ = local_268.x[2][1];
  local_188._0_8_ = local_268.x[2][2];
  local_188._8_8_ = local_268.x[2][3];
  local_178._0_8_ = local_268.x[3][0];
  local_178._8_8_ = local_268.x[3][1];
  local_168 = (undefined1  [8])local_268.x[3][2];
  dStack_160 = local_268.x[3][3];
  testProcrustesWithMatrix<double>((Matrix44<double> *)local_1d8);
  dVar2 = (double)local_1d8._8_8_ * 1.5;
  local_1d8._8_4_ = SUB84(dVar2,0);
  local_1d8._0_8_ = (double)local_1d8._0_8_ * 1.5;
  local_1d8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = uStack_1c0 * 1.5;
  uStack_1c0._0_4_ = SUB84(dVar2,0);
  local_1d8._16_8_ = (double)local_1d8._16_8_ * 1.5;
  uStack_1c0._4_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = dStack_1b0 * 6.4;
  unique0x1000173a = SUB84(dVar2,0);
  local_1b8 = (undefined1  [8])((double)local_1b8 * 6.4);
  unique0x1000173e = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_1a8._8_8_ * 6.4;
  local_1a8._8_4_ = SUB84(dVar2,0);
  local_1a8._0_8_ = (double)local_1a8._0_8_ * 6.4;
  local_1a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_198._8_8_ + (double)local_198._8_8_;
  local_198._8_4_ = SUB84(dVar2,0);
  local_198._0_8_ = (double)local_198._0_8_ + (double)local_198._0_8_;
  local_198._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_188._8_8_ + (double)local_188._8_8_;
  local_188._8_4_ = SUB84(dVar2,0);
  local_188._0_8_ = (double)local_188._0_8_ + (double)local_188._0_8_;
  local_188._12_4_ = (int)((ulong)dVar2 >> 0x20);
  testProcrustesWithMatrix<double>((M44d *)local_1d8);
  Imath_2_5::Euler<double>::toMatrix44(&local_138,&local_158);
  local_268.x[3][2] = 0.0;
  local_268.x[3][3] = 0.0;
  local_268.x[3][0] = 0.0;
  local_268.x[3][1] = 0.0;
  local_268.x[2][2] = 0.0;
  local_268.x[2][3] = 0.0;
  local_268.x[2][0] = 0.0;
  local_268.x[2][1] = 0.0;
  local_268.x[1][2] = 0.0;
  local_268.x[1][3] = 0.0;
  local_268.x[1][0] = 0.0;
  local_268.x[1][1] = 0.0;
  local_268.x[0][2] = 0.0;
  local_268.x[0][3] = 0.0;
  local_268.x[0][0] = 0.0;
  local_268.x[0][1] = 0.0;
  Imath_2_5::Matrix44<double>::multiply((Matrix44<double> *)local_1d8,&local_138,&local_268);
  local_178._8_8_ = local_268.x[3][1];
  local_178._0_8_ = local_268.x[3][0];
  dStack_160 = local_268.x[3][3];
  local_168 = (undefined1  [8])local_268.x[3][2];
  local_1b8 = (undefined1  [8])local_268.x[1][0];
  dStack_1b0 = local_268.x[1][1];
  local_1a8._0_8_ = local_268.x[1][2];
  local_1a8._8_8_ = local_268.x[1][3];
  local_198._0_8_ = local_268.x[2][0];
  local_198._8_8_ = local_268.x[2][1];
  local_188._0_8_ = local_268.x[2][2];
  local_188._8_8_ = local_268.x[2][3];
  local_1d8._0_8_ = (ulong)local_268.x[0][0] ^ 0x8000000000000000;
  local_1d8._8_4_ = SUB84(local_268.x[0][1],0);
  local_1d8._12_4_ = (uint)((ulong)local_268.x[0][1] >> 0x20) ^ 0x80000000;
  local_1d8._16_8_ = (ulong)local_268.x[0][2] ^ 0x8000000000000000;
  uStack_1c0._0_4_ = SUB84(local_268.x[0][3],0);
  uStack_1c0._4_4_ = (uint)((ulong)local_268.x[0][3] >> 0x20) ^ 0x80000000;
  testProcrustesWithMatrix<double>((Matrix44<double> *)local_1d8);
  dVar2 = dStack_1b0 * 0.001;
  unique0x100017ca = SUB84(dVar2,0);
  local_1b8 = (undefined1  [8])((double)local_1b8 * 0.001);
  unique0x100017ce = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_1a8._8_8_ * 0.001;
  local_1a8._8_4_ = SUB84(dVar2,0);
  local_1a8._0_8_ = (double)local_1a8._0_8_ * 0.001;
  local_1a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  testProcrustesWithMatrix<double>((M44d *)local_1d8);
  dVar2 = (double)local_198._8_8_ * 0.0;
  local_198._8_4_ = SUB84(dVar2,0);
  local_198._0_8_ = (double)local_198._0_8_ * 0.0;
  local_198._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar2 = (double)local_188._8_8_ * 0.0;
  local_188._8_4_ = SUB84(dVar2,0);
  local_188._0_8_ = (double)local_188._0_8_ * 0.0;
  local_188._12_4_ = (int)((ulong)dVar2 >> 0x20);
  testProcrustesWithMatrix<double>((M44d *)local_1d8);
  if (local_2a8.
      super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.
      super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.
                    super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
testProcrustesImp ()
{
    // Test the empty case:
    IMATH_INTERNAL_NAMESPACE::M44d id = 
        procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                          (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                          (T*) 0,
                                          0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    id = procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                           (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                           0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    // First we'll test with a bunch of known translation/rotation matrices
    // to make sure we get back exactly the same points:
    IMATH_INTERNAL_NAMESPACE::M44d m;
    m.makeIdentity();
    testTranslationRotationMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(3.0, 5.0, -0.2));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testTranslationRotationMatrix<T> (m);
    
    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testTranslationRotationMatrix<T> (m);

    m.makeIdentity();
    testWithTranslateRotateAndScale<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(0.4, 6.0, 10.0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(2.0, 2.0, 2.0));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(0.01, 0.01, 0.01));
    testWithTranslateRotateAndScale<T> (m);

    // Now we'll test with some random point sets and verify
    // the various Procrustes properties:
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;
    fromPoints.clear(); toPoints.clear();

    for (size_t i = 0; i < 4; ++i)
    {
        const T theta = T(2*i) / T(M_PI);
        fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta), sin(theta), 0));
        toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta + M_PI/3.0), sin(theta + M_PI/3.0), 0));
    }
    verifyProcrustes (fromPoints, toPoints);

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
        }
    }
    verifyProcrustes (fromPoints, toPoints);

    // Test with some known matrices of varying degrees of quality:
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(3, 4, 1));
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-10, 2, 1));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot (M_PI/3.0, 3.0*M_PI/4.0, 0);
    m = m * rot.toMatrix44();
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1.5, 6.4, 2.0));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot2 (1.0, M_PI, M_PI/3.0);
    m = m * rot.toMatrix44();

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-1, 1, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 0.001, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 1, 0));
    testProcrustesWithMatrix<T> (m);
}